

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trsort.c
# Opt level: O0

void tr_partialcopy(saidx64_t *ISA,saidx64_t *SA,saidx64_t *first,saidx64_t *a,saidx64_t *b,
                   saidx64_t *last,saidx64_t depth)

{
  long lVar1;
  saidx64_t *psVar2;
  long lVar3;
  saidx64_t newrank;
  saidx64_t lastrank;
  saidx64_t rank;
  saidx64_t v;
  saidx64_t s;
  saidx64_t *e;
  saidx64_t *d;
  saidx64_t *c;
  saidx64_t *last_local;
  saidx64_t *b_local;
  saidx64_t *a_local;
  saidx64_t *first_local;
  saidx64_t *SA_local;
  saidx64_t *ISA_local;
  
  newrank = -1;
  lVar1 = ((long)b - (long)SA >> 3) + -1;
  lastrank = -1;
  d = a + -1;
  for (c = first; c <= d; c = c + 1) {
    lVar3 = *c - depth;
    if ((-1 < lVar3) && (ISA[lVar3] == lVar1)) {
      d[1] = lVar3;
      if (lastrank != ISA[lVar3 + depth]) {
        newrank = (long)(d + 1) - (long)SA >> 3;
        lastrank = ISA[lVar3 + depth];
      }
      ISA[lVar3] = newrank;
      d = d + 1;
    }
  }
  lastrank = -1;
  for (e = d; first <= e; e = e + -1) {
    lVar3 = ISA[*e];
    if (lastrank != lVar3) {
      newrank = (long)e - (long)SA >> 3;
      lastrank = lVar3;
    }
    if (newrank != lVar3) {
      ISA[*e] = newrank;
    }
  }
  lastrank = -1;
  c = last + -1;
  psVar2 = d + 1;
  d = b;
  while (psVar2 < d) {
    lVar3 = *c - depth;
    if ((-1 < lVar3) && (ISA[lVar3] == lVar1)) {
      d[-1] = lVar3;
      if (lastrank != ISA[lVar3 + depth]) {
        newrank = (long)(d + -1) - (long)SA >> 3;
        lastrank = ISA[lVar3 + depth];
      }
      ISA[lVar3] = newrank;
      d = d + -1;
    }
    c = c + -1;
  }
  return;
}

Assistant:

static
void
tr_partialcopy(saidx_t *ISA, const saidx_t *SA,
               saidx_t *first, saidx_t *a, saidx_t *b, saidx_t *last,
               saidx_t depth) {
  saidx_t *c, *d, *e;
  saidx_t s, v;
  saidx_t rank, lastrank, newrank = -1;

  v = b - SA - 1;
  lastrank = -1;
  for(c = first, d = a - 1; c <= d; ++c) {
    if((0 <= (s = *c - depth)) && (ISA[s] == v)) {
      *++d = s;
      rank = ISA[s + depth];
      if(lastrank != rank) { lastrank = rank; newrank = d - SA; }
      ISA[s] = newrank;
    }
  }

  lastrank = -1;
  for(e = d; first <= e; --e) {
    rank = ISA[*e];
    if(lastrank != rank) { lastrank = rank; newrank = e - SA; }
    if(newrank != rank) { ISA[*e] = newrank; }
  }

  lastrank = -1;
  for(c = last - 1, e = d + 1, d = b; e < d; --c) {
    if((0 <= (s = *c - depth)) && (ISA[s] == v)) {
      *--d = s;
      rank = ISA[s + depth];
      if(lastrank != rank) { lastrank = rank; newrank = d - SA; }
      ISA[s] = newrank;
    }
  }
}